

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV1SoftSkinBlock(Parser *this)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  pointer pBVar4;
  __type _Var5;
  byte *pbVar6;
  ulong uVar7;
  int iVar8;
  byte *pbVar9;
  uint uVar10;
  vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> *this_00;
  pointer this_01;
  uint numVerts;
  uint numWeights;
  string bone;
  string name;
  uint local_ac;
  value_type local_a8;
  uint local_a0;
  uint local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  do {
    pbVar3 = (byte *)this->filePtr;
    bVar1 = *pbVar3;
    if (bVar1 == 0x7b) {
      pbVar9 = pbVar3 + 1;
      this->filePtr = (char *)pbVar9;
    }
    else {
      if (bVar1 == 0) {
        return;
      }
      if (bVar1 == 0x7d) {
        this->filePtr = (char *)(pbVar3 + 1);
        return;
      }
      local_ac = 0;
      uVar7 = 0;
      pbVar9 = pbVar3;
      while( true ) {
        pbVar6 = pbVar9 + 1;
        if ((bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
        this->filePtr = (char *)pbVar6;
        bVar1 = *pbVar6;
        uVar7 = uVar7 + 1;
        pbVar9 = pbVar6;
      }
      if ((uVar7 & 0xffffffff) != 0) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,pbVar3,pbVar3 + (uVar7 & 0xffffffff));
        this_00 = &((this->m_vMeshes).
                    super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>.
                    _M_impl.super__Vector_impl_data._M_start)->mBoneVertices;
LAB_003d1587:
        if ((pointer)((long)(this_00 + -0x1b) + 0x10) !=
            (this->m_vMeshes).
            super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(this_00 + -0x17),&local_70);
          if (!_Var5) break;
          if (this_00 !=
              (vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> *)0x278) {
            SkipSpacesAndLineEnd<char>(&this->filePtr);
            ParseLV4MeshLong(this,&local_ac);
            std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::reserve
                      (this_00,(ulong)local_ac);
            local_78 = (vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_> *)
                       (this_00 + 1);
            uVar10 = 0;
            while (uVar10 < local_ac) {
              SkipSpacesAndLineEnd<char>(&this->filePtr);
              ParseLV4MeshLong(this,&local_a0);
              local_98._M_dataplus._M_p = (pointer)0x0;
              local_98._M_string_length = 0;
              local_98.field_2._M_allocated_capacity = 0;
              std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::
              emplace_back<Assimp::ASE::BoneVertex>(this_00,(BoneVertex *)&local_98);
              local_9c = uVar10;
              std::_Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
              ~_Vector_base((_Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                             *)&local_98);
              this_01 = (this_00->
                        super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                        )._M_impl.super__Vector_impl_data._M_finish + -1;
              uVar7 = (ulong)local_a0;
              std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::reserve
                        (&this_01->mBoneWeights,uVar7);
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              local_98._M_string_length = 0;
              local_98.field_2._M_allocated_capacity =
                   local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
              for (uVar10 = 0; uVar10 < (uint)uVar7; uVar10 = uVar10 + 1) {
                local_98._M_string_length = 0;
                *local_98._M_dataplus._M_p = '\0';
                ParseString(this,&local_98,"*MESH_SOFTSKINVERTS.Bone");
                local_a8.first = -1;
                local_a8.second = 0.0;
                uVar7 = 0;
                while( true ) {
                  iVar8 = (int)uVar7;
                  pBVar4 = (((vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_> *)
                            (this_00 + 1))->
                           super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if ((ulong)((long)(((vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                       *)(this_00 + 1))->
                                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar4 >> 5)
                      <= uVar7) break;
                  _Var5 = std::operator==(&pBVar4[uVar7].mName,&local_98);
                  if (_Var5) {
                    local_a8.first = iVar8;
                    goto LAB_003d16e4;
                  }
                  uVar7 = (ulong)(iVar8 + 1);
                }
                iVar8 = local_a8.first;
LAB_003d16e4:
                if (iVar8 == -1) {
                  local_a8.first =
                       (int)((ulong)((long)(((vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                              *)(this_00 + 1))->
                                           super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(((vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                             *)(this_00 + 1))->
                                          super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 5);
                  std::__cxx11::string::string(local_50,(string *)&local_98);
                  std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::
                  emplace_back<Assimp::ASE::Bone>(local_78,(Bone *)local_50);
                  std::__cxx11::string::~string(local_50);
                }
                ParseLV4MeshFloat(this,&local_a8.second);
                std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                push_back(&this_01->mBoneWeights,&local_a8);
                uVar7 = (ulong)local_a0;
              }
              std::__cxx11::string::~string((string *)&local_98);
              uVar10 = local_9c + 1;
            }
            goto LAB_003d1795;
          }
        }
        LogWarning(this,"Encountered unknown mesh in *MESH_SOFTSKINVERTS section");
        while( true ) {
          SkipSpacesAndLineEnd<char>(&this->filePtr);
          cVar2 = *this->filePtr;
          if (cVar2 == '}') {
            this->filePtr = this->filePtr + 1;
            std::__cxx11::string::~string((string *)&local_70);
            return;
          }
          if (((9 < (byte)(cVar2 - 0x30U)) && (cVar2 != '-')) && (cVar2 != '+')) break;
          SkipLine<char>(&this->filePtr);
        }
LAB_003d1795:
        std::__cxx11::string::~string((string *)&local_70);
        pbVar9 = (byte *)this->filePtr;
      }
    }
    this->filePtr = (char *)(pbVar9 + 1);
    SkipSpacesAndLineEnd<char>(&this->filePtr);
  } while( true );
  this_00 = this_00 + 0x1e;
  goto LAB_003d1587;
}

Assistant:

void Parser::ParseLV1SoftSkinBlock()
{
    // TODO: fix line counting here

    // **************************************************************
    // The soft skin block is formatted differently. There are no
    // nested sections supported and the single elements aren't
    // marked by keywords starting with an asterisk.

    /**
    FORMAT BEGIN

    *MESH_SOFTSKINVERTS {
    <nodename>
    <number of vertices>

    [for <number of vertices> times:]
        <number of weights> [for <number of weights> times:] <bone name> <weight>
    }

    FORMAT END
    */
    // **************************************************************
    while (true)
    {
        if (*filePtr == '}'      )  {++filePtr;return;}
        else if (*filePtr == '\0')  return;
        else if (*filePtr == '{' )  ++filePtr;

        else // if (!IsSpace(*filePtr) && !IsLineEnd(*filePtr))
        {
            ASE::Mesh* curMesh      = NULL;
            unsigned int numVerts   = 0;

            const char* sz = filePtr;
            while (!IsSpaceOrNewLine(*filePtr))++filePtr;

            const unsigned int diff = (unsigned int)(filePtr-sz);
            if (diff)
            {
                std::string name = std::string(sz,diff);
                for (std::vector<ASE::Mesh>::iterator it = m_vMeshes.begin();
                    it != m_vMeshes.end(); ++it)
                {
                    if ((*it).mName == name)
                    {
                        curMesh = & (*it);
                        break;
                    }
                }
                if (!curMesh)
                {
                    LogWarning("Encountered unknown mesh in *MESH_SOFTSKINVERTS section");

                    // Skip the mesh data - until we find a new mesh
                    // or the end of the *MESH_SOFTSKINVERTS section
                    while (true)
                    {
                        SkipSpacesAndLineEnd(&filePtr);
                        if (*filePtr == '}')
                            {++filePtr;return;}
                        else if (!IsNumeric(*filePtr))
                            break;

                        SkipLine(&filePtr);
                    }
                }
                else
                {
                    SkipSpacesAndLineEnd(&filePtr);
                    ParseLV4MeshLong(numVerts);

                    // Reserve enough storage
                    curMesh->mBoneVertices.reserve(numVerts);

                    for (unsigned int i = 0; i < numVerts;++i)
                    {
                        SkipSpacesAndLineEnd(&filePtr);
                        unsigned int numWeights;
                        ParseLV4MeshLong(numWeights);

                        curMesh->mBoneVertices.push_back(ASE::BoneVertex());
                        ASE::BoneVertex& vert = curMesh->mBoneVertices.back();

                        // Reserve enough storage
                        vert.mBoneWeights.reserve(numWeights);

                        std::string bone;
                        for (unsigned int w = 0; w < numWeights;++w) {
                            bone.clear();
                            ParseString(bone,"*MESH_SOFTSKINVERTS.Bone");

                            // Find the bone in the mesh's list
                            std::pair<int,ai_real> me;
                            me.first = -1;

                            for (unsigned int n = 0; n < curMesh->mBones.size();++n) {
                                if (curMesh->mBones[n].mName == bone) {
                                    me.first = n;
                                    break;
                                }
                            }
                            if (-1 == me.first) {
                                // We don't have this bone yet, so add it to the list
                                me.first = static_cast<int>( curMesh->mBones.size() );
                                curMesh->mBones.push_back( ASE::Bone( bone ) );
                            }
                            ParseLV4MeshFloat( me.second );

                            // Add the new bone weight to list
                            vert.mBoneWeights.push_back(me);
                        }
                    }
                }
            }
        }
        ++filePtr;
        SkipSpacesAndLineEnd(&filePtr);
    }
}